

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_27e0899::DWARFObjInMemory::forEachInfoDWOSections
          (DWARFObjInMemory *this,function_ref<void_(const_llvm::DWARFSection_&)> F)

{
  bool bVar1;
  reference ppVar2;
  pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap> *P;
  const_iterator __end2;
  const_iterator __begin2;
  InfoSectionMap *__range2;
  DWARFObjInMemory *this_local;
  function_ref<void_(const_llvm::DWARFSection_&)> F_local;
  
  F_local.callback = (_func_void_intptr_t_DWARFSection_ptr *)F.callable;
  this_local = (DWARFObjInMemory *)F.callback;
  __end2 = llvm::
           MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
           ::begin(&this->InfoDWOSections);
  P = (pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap> *)
      llvm::
      MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
      ::end(&this->InfoDWOSections);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_*,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                                *)&P);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_*,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
             ::operator*(&__end2);
    llvm::function_ref<void_(const_llvm::DWARFSection_&)>::operator()
              ((function_ref<void_(const_llvm::DWARFSection_&)> *)&this_local,
               &(ppVar2->second).super_DWARFSection);
    __gnu_cxx::
    __normal_iterator<const_std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_*,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void forEachInfoDWOSections(
      function_ref<void(const DWARFSection &)> F) const override {
    for (auto &P : InfoDWOSections)
      F(P.second);
  }